

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,true,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  long lVar5;
  int iVar8;
  ulong uVar6;
  long lVar7;
  int iVar9;
  ulong uVar10;
  int64_t *piVar11;
  idx_t iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  int64_t *local_88;
  ulong local_80;
  
  puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5._0_4_ = ldata->months;
      lVar5._4_4_ = ldata->days;
      lVar7 = ldata->micros;
      lVar16 = (lVar5 >> 0x20) + lVar7 / 86400000000;
      local_88 = &rdata->micros;
      iVar12 = 0;
      do {
        uVar2 = ((interval_t *)(local_88 + -1))->months;
        iVar9 = ((interval_t *)(local_88 + -1))->days;
        lVar17 = *local_88;
        if ((lVar5._4_4_ == iVar9 && (undefined4)lVar5 == uVar2) &&
           (iVar9 = lVar5._4_4_, lVar7 == lVar17)) {
          bVar19 = false;
        }
        else {
          lVar18 = (long)iVar9 + lVar17 / 86400000000;
          bVar19 = true;
          if (((long)(int)(undefined4)lVar5 + lVar16 / 0x1e == (long)(int)uVar2 + lVar18 / 0x1e) &&
             (lVar16 % 0x1e == lVar18 % 0x1e)) {
            bVar19 = lVar7 % 86400000000 != lVar17 % 86400000000;
          }
        }
        result_data[iVar12] = bVar19;
        iVar12 = iVar12 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_80 = 0;
    uVar13 = 0;
    do {
      uVar4 = puVar3[uVar13];
      uVar14 = local_80 + 0x40;
      if (count <= local_80 + 0x40) {
        uVar14 = count;
      }
      uVar10 = uVar14;
      if (uVar4 != 0) {
        uVar10 = local_80;
        if (uVar4 == 0xffffffffffffffff) {
          if (local_80 < uVar14) {
            lVar7._0_4_ = ldata->months;
            lVar7._4_4_ = ldata->days;
            lVar5 = ldata->micros;
            lVar16 = (lVar7 >> 0x20) + lVar5 / 86400000000;
            piVar11 = &rdata[local_80].micros;
            do {
              uVar1 = ((interval_t *)(piVar11 + -1))->months;
              iVar8 = ((interval_t *)(piVar11 + -1))->days;
              lVar17 = *piVar11;
              if ((lVar7._4_4_ == iVar8 && (undefined4)lVar7 == uVar1) &&
                 (iVar8 = lVar7._4_4_, lVar5 == lVar17)) {
                bVar19 = false;
              }
              else {
                lVar18 = (long)iVar8 + lVar17 / 86400000000;
                bVar19 = true;
                if (((long)(int)(undefined4)lVar7 + lVar16 / 0x1e ==
                     (long)(int)uVar1 + lVar18 / 0x1e) && (lVar16 % 0x1e == lVar18 % 0x1e)) {
                  bVar19 = lVar5 % 86400000000 != lVar17 % 86400000000;
                }
              }
              result_data[local_80] = bVar19;
              local_80 = local_80 + 1;
              piVar11 = piVar11 + 2;
              uVar10 = uVar14;
            } while (uVar14 != local_80);
          }
        }
        else if (local_80 < uVar14) {
          piVar11 = &rdata[local_80].micros;
          uVar15 = 0;
          do {
            if ((uVar4 >> (uVar15 & 0x3f) & 1) != 0) {
              uVar10._0_4_ = ldata->months;
              uVar10._4_4_ = ldata->days;
              lVar5 = ldata->micros;
              uVar6._0_4_ = ((interval_t *)(piVar11 + -1))->months;
              uVar6._4_4_ = ((interval_t *)(piVar11 + -1))->days;
              lVar7 = *piVar11;
              if ((uVar10 >> 0x20 == uVar6 >> 0x20 && (undefined4)uVar10 == (undefined4)uVar6) &&
                 (uVar6._4_4_ = uVar10._4_4_, lVar5 == lVar7)) {
                bVar19 = false;
              }
              else {
                lVar16 = ((long)uVar10 >> 0x20) + lVar5 / 86400000000;
                lVar17 = (long)uVar6._4_4_ + lVar7 / 86400000000;
                bVar19 = true;
                if (((long)(int)(undefined4)uVar10 + lVar16 / 0x1e ==
                     (long)(int)(undefined4)uVar6 + lVar17 / 0x1e) &&
                   (lVar16 % 0x1e == lVar17 % 0x1e)) {
                  bVar19 = lVar5 % 86400000000 != lVar7 % 86400000000;
                }
              }
              result_data[uVar15 + local_80] = bVar19;
            }
            uVar15 = uVar15 + 1;
            piVar11 = piVar11 + 2;
            uVar10 = uVar14;
          } while (uVar14 - local_80 != uVar15);
        }
      }
      local_80 = uVar10;
      uVar13 = uVar13 + 1;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}